

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall
slang::ast::PackedStructType::PackedStructType
          (PackedStructType *this,Compilation *compilation,bool isSigned,SourceLocation loc,
          ASTContext *context)

{
  SourceLocation loc_00;
  string_view name;
  byte bVar1;
  int iVar2;
  Symbol *in_RCX;
  byte in_DL;
  Compilation *in_RSI;
  Compilation *in_RDI;
  IntegralType *in_R8;
  undefined4 uVar3;
  SymbolIndex in_stack_ffffffffffffffb4;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  bitwidth_t in_stack_ffffffffffffffd0;
  SymbolKind in_stack_ffffffffffffffd4;
  undefined7 in_stack_ffffffffffffffe0;
  Compilation *pCVar4;
  
  bVar1 = in_DL & 1;
  pCVar4 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffc0,(char *)in_RDI);
  uVar3 = 0;
  name._M_str = (char *)pCVar4;
  name._M_len = (size_t)in_RSI;
  loc_00._7_1_ = bVar1;
  loc_00._0_7_ = in_stack_ffffffffffffffe0;
  IntegralType::IntegralType
            (in_R8,in_stack_ffffffffffffffd4,name,loc_00,in_stack_ffffffffffffffd0,
             (bool)in_stack_ffffffffffffffcf,(bool)in_stack_ffffffffffffffce);
  Scope::Scope((Scope *)in_RCX,in_RDI,(Symbol *)CONCAT44(in_stack_ffffffffffffffb4,uVar3));
  iVar2 = Compilation::getNextStructSystemId(in_RSI);
  *(int *)&(in_RDI->options).paramOverrides.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start = iVar2;
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x5505f1);
  Symbol::setParent(in_RCX,(Scope *)in_RDI,in_stack_ffffffffffffffb4);
  return;
}

Assistant:

PackedStructType::PackedStructType(Compilation& compilation, bool isSigned, SourceLocation loc,
                                   const ASTContext& context) :
    IntegralType(SymbolKind::PackedStructType, "", loc, 0, isSigned, false),
    Scope(compilation, this), systemId(compilation.getNextStructSystemId()) {

    // Struct types don't live as members of the parent scope (they're "owned" by
    // the declaration containing them) but we hook up the parent pointer so that
    // it can participate in name lookups.
    setParent(*context.scope, context.lookupIndex);
}